

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yyPush(GREG *G,char *text,int count,yythunk *thunk,PVIPParserContext yyxvar)

{
  int iVar1;
  PVIPNode **ppPVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = ((long)G->val - (long)G->vals >> 3) + (long)count;
  if ((ulong)(long)G->valslen < uVar4) {
    iVar1 = G->valslen;
    uVar3 = (ulong)iVar1;
    if (uVar3 < uVar4 + 1) {
      do {
        iVar1 = iVar1 * 2;
        uVar3 = (ulong)iVar1;
      } while (uVar3 < uVar4 + 1);
      G->valslen = iVar1;
    }
    ppPVar2 = (PVIPNode **)realloc(G->vals,uVar3 << 3);
    G->vals = ppPVar2;
    ppPVar2 = ppPVar2 + uVar4;
  }
  else {
    ppPVar2 = G->val + count;
  }
  G->val = ppPVar2;
  return;
}

Assistant:

YY_LOCAL(void) yyPush(GREG *G, char *text, int count, yythunk *thunk, YY_XTYPE YY_XVAR)	{
  size_t off = (G->val - G->vals) + count;
  if (off > G->valslen) {
    while (G->valslen < off + 1)
      G->valslen *= 2;
    G->vals= (YYSTYPE*)YY_REALLOC((void *)G->vals, sizeof(YYSTYPE) * G->valslen, G->data);
    G->val= G->vals + off;
  } else {
    G->val += count;
  }
}